

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eumorphic.hpp
# Opt level: O0

void __thiscall
eumorphic::ordered_collection<container,_a,_b,_c>::insert<a>
          (ordered_collection<container,_a,_b,_c> *this,a *value)

{
  vector<a,_std::allocator<a>_> *this_00;
  value_type local_28;
  integral_constant local_19;
  a *paStack_18;
  integral_constant<unsigned_long,_0UL> type_index;
  a *value_local;
  ordered_collection<container,_a,_b,_c> *this_local;
  
  local_19 = (integral_constant)0x0;
  paStack_18 = value;
  local_28 = std::integral_constant::operator_cast_to_unsigned_long(&local_19);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (&this->types_order,&local_28);
  this_00 = boost::hana::at_t::operator()
                      ((at_t *)&boost::hana::at,
                       (tuple<std::vector<a,_std::allocator<a>_>,_std::vector<b,_std::allocator<b>_>,_std::vector<c,_std::allocator<c>_>_>
                        *)this,(integral_constant<unsigned_long,_0UL> *)&local_19);
  std::vector<a,_std::allocator<a>_>::push_back(this_00,paStack_18);
  return;
}

Assistant:

constexpr void insert(T&& value)
		{
                        using namespace detail;
						using Td = std::decay_t<T>;
                        constexpr auto  type_index = index_of(Base::segments_container_t, hana::type_c< Container<Td> >);

                        types_order.push_back( type_index );

                        hana::at(Base::data_, type_index).push_back(std::forward<T>(value));
		}